

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BitIdx.h
# Opt level: O0

size_t axl::sl::getAllocSize<4096ul>(size_t size)

{
  ulong in_RDI;
  undefined8 local_10;
  
  if (in_RDI < 0x1000) {
    local_10 = getPowerOf2Ge64(in_RDI);
  }
  else {
    local_10 = align<4096ul,unsigned_long>(in_RDI);
  }
  return local_10;
}

Assistant:

size_t
getAllocSize(size_t size) {
	ASSERT(isPowerOf2(growLimit));
	return size < growLimit ? getPowerOf2Ge(size) : align<growLimit> (size);
}